

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O0

bool __thiscall
llama_model_loader::get_arr<int,4ul>
          (llama_model_loader *this,string *key,array<int,_4UL> *result,bool required)

{
  int iVar1;
  pointer pgVar2;
  undefined8 uVar3;
  runtime_error *prVar4;
  int *__result;
  byte in_CL;
  ArrayInfo arr_info;
  int kid;
  unique_ptr<gguf_context,_gguf_context_deleter> *in_stack_ffffffffffffff00;
  int *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  string local_b8 [20];
  int in_stack_ffffffffffffff5c;
  gguf_context *in_stack_ffffffffffffff60;
  string local_90 [32];
  int local_70;
  uint local_68;
  undefined4 uStack_64;
  long local_60;
  undefined1 local_55;
  string local_48 [32];
  int local_28;
  byte local_21;
  
  local_21 = in_CL & 1;
  pgVar2 = std::unique_ptr<gguf_context,_gguf_context_deleter>::get(in_stack_ffffffffffffff00);
  uVar3 = std::__cxx11::string::c_str();
  local_28 = gguf_find_key(pgVar2,uVar3);
  if (-1 < local_28) {
    pgVar2 = std::unique_ptr<gguf_context,_gguf_context_deleter>::get(in_stack_ffffffffffffff00);
    iVar1 = gguf_get_kv_type(pgVar2,(long)local_28);
    if (iVar1 == 9) {
      std::unique_ptr<gguf_context,_gguf_context_deleter>::get(in_stack_ffffffffffffff00);
      GGUFMeta::GKV<GGUFMeta::ArrayInfo>::get_kv
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      if (local_70 != 5) {
        if (local_70 != 6) {
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          uVar3 = std::__cxx11::string::c_str();
          format_abi_cxx11_((char *)local_90,"%s is not a float32, int32 array",uVar3);
          std::runtime_error::runtime_error(prVar4,local_90);
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model-loader.cpp"
                   ,0x14d,"GGML_ASSERT(%s) failed","(std::is_same<T, float>::value)");
      }
      if (CONCAT44(uStack_64,local_68) < 5) {
        __result = (int *)(local_60 + CONCAT44(uStack_64,local_68) * 4);
        std::array<int,_4UL>::begin((array<int,_4UL> *)0x4612b3);
        std::copy<int_const*,int*>
                  ((int *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   in_stack_ffffffffffffff08,__result);
        return true;
      }
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      uVar3 = std::__cxx11::string::c_str();
      format_abi_cxx11_((char *)local_b8,"array length %u for key %s exceeds max %u",(ulong)local_68
                        ,uVar3,4);
      std::runtime_error::runtime_error(prVar4,local_b8);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  if ((local_21 & 1) == 0) {
    return false;
  }
  local_55 = 1;
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  uVar3 = std::__cxx11::string::c_str();
  format_abi_cxx11_((char *)local_48,"array key not found in model: %s",uVar3);
  std::runtime_error::runtime_error(prVar4,local_48);
  local_55 = 0;
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool llama_model_loader::get_arr(const std::string & key, std::array<T, N_MAX> & result, bool required) {
        const int kid = gguf_find_key(meta.get(), key.c_str());

        if (kid < 0 || gguf_get_kv_type(meta.get(), kid) != GGUF_TYPE_ARRAY) {
            if (required) {
                throw std::runtime_error(format("array key not found in model: %s", key.c_str()));
            }
            return false;
        }

        struct GGUFMeta::ArrayInfo arr_info =
            GGUFMeta::GKV<GGUFMeta::ArrayInfo>::get_kv(meta.get(), kid);

        switch (arr_info.gt) {
            case GGUF_TYPE_FLOAT32: GGML_ASSERT((std::is_same<T, float>::value)); break;
            case GGUF_TYPE_INT32:   GGML_ASSERT(
                                            (std::is_same<T,  int32_t>::value) ||
                                            (std::is_same<T, uint32_t>::value));  break;
            default:
                throw std::runtime_error(format("%s is not a float32, int32 array", key.c_str()));
        }

        if (arr_info.length > N_MAX) {
            throw std::runtime_error(format("array length %u for key %s exceeds max %u", (uint32_t) arr_info.length, key.c_str(), (uint32_t) N_MAX));
        }

        std::copy((const T*)arr_info.data, (const T *)arr_info.data + arr_info.length, result.begin());

        return true;
    }